

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_iterl(jit_State *J,BCIns iterins)

{
  uint uVar1;
  BCReg ra;
  BCIns iterins_local;
  jit_State *J_local;
  LoopEvent local_4;
  
  uVar1 = iterins >> 8 & 0xff;
  if ((J->base[uVar1] & 0x1f000000) == 0) {
    J->maxslot = uVar1 - 3;
    J->pc = J->pc + 1;
    local_4 = LOOPEV_LEAVE;
  }
  else {
    J->base[uVar1 - 1] = J->base[uVar1];
    J->maxslot = (uVar1 - 1) + (J->pc[-1] >> 0x18);
    J->pc = J->pc + ((ulong)(iterins >> 0x10) - 0x7fff);
    local_4 = LOOPEV_ENTER;
  }
  return local_4;
}

Assistant:

static LoopEvent rec_iterl(jit_State *J, const BCIns iterins)
{
  BCReg ra = bc_a(iterins);
  lua_assert(J->base[ra] != 0);
  if (!tref_isnil(J->base[ra])) {  /* Looping back? */
    J->base[ra-1] = J->base[ra];  /* Copy result of ITERC to control var. */
    J->maxslot = ra-1+bc_b(J->pc[-1]);
    J->pc += bc_j(iterins)+1;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc++;
    return LOOPEV_LEAVE;
  }
}